

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QRenderRule * __thiscall QRenderRule::operator=(QRenderRule *this,QRenderRule *param_1)

{
  undefined4 uVar1;
  Data *pDVar2;
  QStyleSheetPaletteData *pQVar3;
  QStyleSheetBoxData *pQVar4;
  QStyleSheetBoxData *pQVar5;
  QStyleSheetBackgroundData *pQVar6;
  QStyleSheetBorderData *pQVar7;
  QStyleSheetOutlineData *pQVar8;
  QStyleSheetGeometryData *pQVar9;
  QStyleSheetGeometryData *pQVar10;
  QStyleSheetPositionData *pQVar11;
  QStyleSheetPositionData *pQVar12;
  QStyleSheetImageData *pQVar13;
  undefined7 uVar14;
  QBrush QVar15;
  undefined7 uVar16;
  QFont QVar17;
  QPainterPath QVar18;
  long in_FS_OFFSET;
  QSharedDataPointer<QStyleSheetOutlineData> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->features = param_1->features;
  QVar15 = this->defaultBackground;
  uVar16 = *(undefined7 *)&this->field_0x9;
  uVar14 = *(undefined7 *)&param_1->field_0x9;
  this->defaultBackground = param_1->defaultBackground;
  *(undefined7 *)&this->field_0x9 = uVar14;
  param_1->defaultBackground = QVar15;
  *(undefined7 *)&param_1->field_0x9 = uVar16;
  QVar17 = this->font;
  uVar16 = *(undefined7 *)&this->field_0x11;
  uVar14 = *(undefined7 *)&param_1->field_0x11;
  this->font = param_1->font;
  *(undefined7 *)&this->field_0x11 = uVar14;
  param_1->font = QVar17;
  *(undefined7 *)&param_1->field_0x11 = uVar16;
  uVar1 = *(undefined4 *)&this->field_0x18;
  *(undefined4 *)&this->field_0x18 = *(undefined4 *)&param_1->field_0x18;
  *(undefined4 *)&param_1->field_0x18 = uVar1;
  this->hasFont = param_1->hasFont;
  pDVar2 = (param_1->styleHints).d;
  (param_1->styleHints).d = (Data *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(this->styleHints).d;
  (this->styleHints).d = pDVar2;
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_30);
  pQVar3 = (param_1->pal).d.ptr;
  (param_1->pal).d.ptr = (QStyleSheetPaletteData *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(this->pal).d.ptr;
  (this->pal).d.ptr = pQVar3;
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetPaletteData> *)&local_30);
  pQVar4 = (param_1->b).d.ptr;
  (param_1->b).d.ptr = (QStyleSheetBoxData *)0x0;
  pQVar5 = (this->b).d.ptr;
  (this->b).d.ptr = pQVar4;
  if (pQVar5 != (QStyleSheetBoxData *)0x0) {
    LOCK();
    (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      operator_delete(pQVar5,0x28);
    }
  }
  pQVar6 = (param_1->bg).d.ptr;
  (param_1->bg).d.ptr = (QStyleSheetBackgroundData *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(this->bg).d.ptr;
  (this->bg).d.ptr = pQVar6;
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBackgroundData> *)&local_30);
  pQVar7 = (param_1->bd).d.ptr;
  (param_1->bd).d.ptr = (QStyleSheetBorderData *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(this->bd).d.ptr;
  (this->bd).d.ptr = pQVar7;
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBorderData> *)&local_30);
  pQVar8 = (param_1->ou).d.ptr;
  (param_1->ou).d.ptr = (QStyleSheetOutlineData *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(this->ou).d.ptr;
  (this->ou).d.ptr = pQVar8;
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_30);
  pQVar9 = (param_1->geo).d.ptr;
  (param_1->geo).d.ptr = (QStyleSheetGeometryData *)0x0;
  pQVar10 = (this->geo).d.ptr;
  (this->geo).d.ptr = pQVar9;
  if (pQVar10 != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      operator_delete(pQVar10,0x1c);
    }
  }
  pQVar11 = (param_1->p).d.ptr;
  (param_1->p).d.ptr = (QStyleSheetPositionData *)0x0;
  pQVar12 = (this->p).d.ptr;
  (this->p).d.ptr = pQVar11;
  if (pQVar12 != (QStyleSheetPositionData *)0x0) {
    LOCK();
    (pQVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      operator_delete(pQVar12,0x24);
    }
  }
  pQVar13 = (param_1->img).d.ptr;
  (param_1->img).d.ptr = (QStyleSheetImageData *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(this->img).d.ptr;
  (this->img).d.ptr = pQVar13;
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetImageData> *)&local_30);
  pQVar13 = (param_1->iconPtr).d.ptr;
  (param_1->iconPtr).d.ptr = (QStyleSheetImageData *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(this->iconPtr).d.ptr;
  (this->iconPtr).d.ptr = pQVar13;
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetImageData> *)&local_30);
  this->clipset = param_1->clipset;
  QVar18 = this->clipPath;
  uVar16 = *(undefined7 *)&this->field_0x81;
  uVar14 = *(undefined7 *)&param_1->field_0x81;
  this->clipPath = param_1->clipPath;
  *(undefined7 *)&this->field_0x81 = uVar14;
  param_1->clipPath = QVar18;
  *(undefined7 *)&param_1->field_0x81 = uVar16;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QRenderRule() : features(0), hasFont(false), pal(nullptr), b(nullptr), bg(nullptr), bd(nullptr), ou(nullptr), geo(nullptr), p(nullptr), img(nullptr), clipset(0) { }